

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool __thiscall ExpressionContext::IsGenericInstance(ExpressionContext *this,FunctionData *function)

{
  TypeClass *pTVar1;
  TypeClass *typeClass;
  FunctionData *function_local;
  ExpressionContext *this_local;
  
  if ((function->isGenericInstance & 1U) == 0) {
    if (function->proto == (FunctionData *)0x0) {
      if (((function->scope->ownerType == (TypeBase *)0x0) ||
          (pTVar1 = getType<TypeClass>(function->scope->ownerType), pTVar1 == (TypeClass *)0x0)) ||
         (pTVar1->proto == (TypeGenericClassProto *)0x0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ExpressionContext::IsGenericInstance(FunctionData *function)
{
	if(function->isGenericInstance)
		return true;

	if(function->proto != NULL)
		return true;

	if(function->scope->ownerType)
	{
		if(TypeClass *typeClass = getType<TypeClass>(function->scope->ownerType))
		{
			if(typeClass->proto)
				return true;
		}
	}

	return false;
}